

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_iterator.c
# Opt level: O2

void kcc_iterator_next(kcc_iterator_nbx *b)

{
  kcc_joint *pkVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  kcc_joint *pkVar5;
  kcc_segment *pkVar6;
  gc_pose *pgVar7;
  undefined8 uVar8;
  vector3 *pvVar9;
  uint __line;
  undefined4 uVar10;
  long lVar11;
  char *__assertion;
  
  if (b == (kcc_iterator_nbx *)0x0) {
    __assertion = "b";
    __line = 0x1f;
  }
  else {
    piVar3 = b->current_index;
    if (piVar3 == (int *)0x0) {
      __assertion = "b->current_index";
      __line = 0x20;
    }
    else {
      piVar4 = b->next_index;
      if (piVar4 == (int *)0x0) {
        __assertion = "b->next_index";
        __line = 0x21;
      }
      else {
        pkVar5 = b->joint;
        if (pkVar5 == (kcc_joint *)0x0) {
          __assertion = "b->joint";
          __line = 0x22;
        }
        else if (b->joint_type == (joint_type *)0x0) {
          __assertion = "b->joint_type";
          __line = 0x23;
        }
        else if (b->x_link == (gc_pose *)0x0) {
          __assertion = "b->x_link";
          __line = 0x24;
        }
        else {
          if (b->has_next != (_Bool *)0x0) {
            iVar2 = *piVar3;
            lVar11 = (long)iVar2 + 1;
            *piVar3 = (int)lVar11;
            *piVar4 = iVar2 + 2;
            pkVar6 = b->chain->segment;
            (pkVar5->field_1).revolute_joint.inertia =
                 pkVar6[lVar11].joint.field_1.revolute_joint.inertia;
            pkVar1 = &pkVar6[lVar11].joint;
            uVar10 = *(undefined4 *)&pkVar1->field_0x4;
            uVar8 = *(undefined8 *)&pkVar1->field_1;
            pkVar5->type = pkVar1->type;
            *(undefined4 *)&pkVar5->field_0x4 = uVar10;
            *(undefined8 *)&pkVar5->field_1 = uVar8;
            pkVar6 = b->chain->segment;
            *b->joint_type = pkVar6[lVar11].joint.type;
            pgVar7 = b->x_link;
            pkVar6 = pkVar6 + lVar11;
            pvVar9 = (pkVar6->joint_attachment).translation;
            pgVar7->rotation = (pkVar6->joint_attachment).rotation;
            pgVar7->translation = pvVar9;
            *b->has_next = (int)lVar11 < b->chain->number_of_segments;
            return;
          }
          __assertion = "b->has_next";
          __line = 0x25;
        }
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                ,__line,"void kcc_iterator_next(struct kcc_iterator_nbx *)");
}

Assistant:

void kcc_iterator_next(
        struct kcc_iterator_nbx *b)
{
    assert(b);
    assert(b->current_index);
    assert(b->next_index);
    assert(b->joint);
    assert(b->joint_type);
    assert(b->x_link);
    assert(b->has_next);

    int index = *b->current_index + 1;

    *b->current_index = index;
    *b->next_index = index + 1;
    *b->joint = b->chain->segment[index].joint;
    *b->joint_type = b->chain->segment[index].joint.type;
    *b->x_link = b->chain->segment[index].joint_attachment;
    *b->has_next = (index < b->chain->number_of_segments);
}